

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vp8_dec.c
# Opt level: O3

int GetLargeValue(VP8BitReader *br,uint8_t *p)

{
  ulong *puVar1;
  ulong uVar2;
  uint uVar3;
  int iVar4;
  byte bVar5;
  bit_t bVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  byte *pbVar10;
  uint uVar11;
  uint uVar12;
  range_t rVar13;
  uint uVar14;
  int iVar15;
  
  bVar5 = p[3];
  rVar13 = br->range_;
  iVar4 = br->bits_;
  if (iVar4 < 0) {
    puVar1 = (ulong *)br->buf_;
    if (puVar1 < br->buf_max_) {
      uVar2 = *puVar1;
      br->buf_ = (uint8_t *)((long)puVar1 + 7);
      br->value_ = br->value_ << 0x38 |
                   ((uVar2 & 0xff000000000000) >> 0x28 | (uVar2 & 0xff0000000000) >> 0x18 |
                    (uVar2 & 0xff00000000) >> 8 | (uVar2 & 0xff000000) << 8 |
                    (uVar2 & 0xff0000) << 0x18 | (uVar2 & 0xff00) << 0x28 | uVar2 << 0x38) >> 8;
      iVar4 = iVar4 + 0x38;
    }
    else {
      VP8LoadFinalBytes(br);
      iVar4 = br->bits_;
    }
  }
  uVar7 = bVar5 * rVar13 >> 8;
  bVar6 = br->value_;
  uVar8 = (uint)(bVar6 >> ((byte)iVar4 & 0x3f));
  if (uVar7 < uVar8) {
    uVar12 = rVar13 - uVar7;
    bVar6 = bVar6 - ((ulong)uVar7 + 1 << ((byte)iVar4 & 0x3f));
    br->value_ = bVar6;
  }
  else {
    uVar12 = uVar7 + 1;
  }
  uVar11 = 0x1f;
  if (uVar12 != 0) {
    for (; uVar12 >> uVar11 == 0; uVar11 = uVar11 - 1) {
    }
  }
  iVar4 = iVar4 - (uVar11 ^ 7);
  rVar13 = (uVar12 << ((byte)(uVar11 ^ 7) & 0x1f)) - 1;
  br->bits_ = iVar4;
  br->range_ = rVar13;
  if (uVar7 < uVar8) {
    bVar5 = p[6];
    if (iVar4 < 0) {
      puVar1 = (ulong *)br->buf_;
      if (puVar1 < br->buf_max_) {
        uVar2 = *puVar1;
        br->buf_ = (uint8_t *)((long)puVar1 + 7);
        bVar6 = bVar6 << 0x38 |
                ((uVar2 & 0xff000000000000) >> 0x28 | (uVar2 & 0xff0000000000) >> 0x18 |
                 (uVar2 & 0xff00000000) >> 8 | (uVar2 & 0xff000000) << 8 |
                 (uVar2 & 0xff0000) << 0x18 | (uVar2 & 0xff00) << 0x28 | uVar2 << 0x38) >> 8;
        br->value_ = bVar6;
        iVar4 = iVar4 + 0x38;
      }
      else {
        VP8LoadFinalBytes(br);
        iVar4 = br->bits_;
        bVar6 = br->value_;
      }
    }
    uVar7 = bVar5 * rVar13 >> 8;
    uVar8 = (uint)(bVar6 >> ((byte)iVar4 & 0x3f));
    if (uVar7 < uVar8) {
      uVar12 = rVar13 - uVar7;
      bVar6 = bVar6 - ((ulong)uVar7 + 1 << ((byte)iVar4 & 0x3f));
      br->value_ = bVar6;
    }
    else {
      uVar12 = uVar7 + 1;
    }
    uVar11 = 0x1f;
    if (uVar12 != 0) {
      for (; uVar12 >> uVar11 == 0; uVar11 = uVar11 - 1) {
      }
    }
    iVar4 = iVar4 - (uVar11 ^ 7);
    rVar13 = (uVar12 << ((byte)(uVar11 ^ 7) & 0x1f)) - 1;
    br->bits_ = iVar4;
    br->range_ = rVar13;
    if (uVar7 < uVar8) {
      bVar5 = p[8];
      if (iVar4 < 0) {
        puVar1 = (ulong *)br->buf_;
        if (puVar1 < br->buf_max_) {
          uVar2 = *puVar1;
          br->buf_ = (uint8_t *)((long)puVar1 + 7);
          bVar6 = bVar6 << 0x38 |
                  ((uVar2 & 0xff000000000000) >> 0x28 | (uVar2 & 0xff0000000000) >> 0x18 |
                   (uVar2 & 0xff00000000) >> 8 | (uVar2 & 0xff000000) << 8 |
                   (uVar2 & 0xff0000) << 0x18 | (uVar2 & 0xff00) << 0x28 | uVar2 << 0x38) >> 8;
          br->value_ = bVar6;
          iVar4 = iVar4 + 0x38;
        }
        else {
          VP8LoadFinalBytes(br);
          iVar4 = br->bits_;
          bVar6 = br->value_;
        }
      }
      uVar8 = bVar5 * rVar13 >> 8;
      uVar7 = (uint)(bVar6 >> ((byte)iVar4 & 0x3f));
      if (uVar8 < uVar7) {
        uVar12 = rVar13 - uVar8;
        bVar6 = bVar6 - ((ulong)uVar8 + 1 << ((byte)iVar4 & 0x3f));
        br->value_ = bVar6;
      }
      else {
        uVar12 = uVar8 + 1;
      }
      uVar11 = 0x1f;
      if (uVar12 != 0) {
        for (; uVar12 >> uVar11 == 0; uVar11 = uVar11 - 1) {
        }
      }
      rVar13 = (uVar12 << ((byte)(uVar11 ^ 7) & 0x1f)) - 1;
      iVar4 = iVar4 - (uVar11 ^ 7);
      br->bits_ = iVar4;
      br->range_ = rVar13;
      bVar5 = p[(ulong)(uVar8 < uVar7) + 9];
      if (iVar4 < 0) {
        puVar1 = (ulong *)br->buf_;
        if (puVar1 < br->buf_max_) {
          uVar2 = *puVar1;
          br->buf_ = (uint8_t *)((long)puVar1 + 7);
          bVar6 = bVar6 << 0x38 |
                  ((uVar2 & 0xff000000000000) >> 0x28 | (uVar2 & 0xff0000000000) >> 0x18 |
                   (uVar2 & 0xff00000000) >> 8 | (uVar2 & 0xff000000) << 8 |
                   (uVar2 & 0xff0000) << 0x18 | (uVar2 & 0xff00) << 0x28 | uVar2 << 0x38) >> 8;
          br->value_ = bVar6;
          iVar4 = iVar4 + 0x38;
        }
        else {
          VP8LoadFinalBytes(br);
          iVar4 = br->bits_;
          bVar6 = br->value_;
        }
      }
      uVar11 = bVar5 * rVar13 >> 8;
      uVar12 = (uint)(bVar6 >> ((byte)iVar4 & 0x3f));
      if (uVar11 < uVar12) {
        uVar14 = rVar13 - uVar11;
        bVar6 = bVar6 - ((ulong)uVar11 + 1 << ((byte)iVar4 & 0x3f));
        br->value_ = bVar6;
      }
      else {
        uVar14 = uVar11 + 1;
      }
      uVar3 = 0x1f;
      if (uVar14 != 0) {
        for (; uVar14 >> uVar3 == 0; uVar3 = uVar3 - 1) {
        }
      }
      iVar4 = iVar4 - (uVar3 ^ 7);
      br->bits_ = iVar4;
      rVar13 = (uVar14 << ((byte)(uVar3 ^ 7) & 0x1f)) - 1;
      br->range_ = rVar13;
      uVar8 = (uint)(uVar11 < uVar12) + (uint)(uVar8 < uVar7) * 2;
      pbVar10 = kCat3456[uVar8];
      bVar5 = *pbVar10;
      if (bVar5 == 0) {
        iVar9 = 0;
      }
      else {
        iVar9 = 0;
        do {
          pbVar10 = pbVar10 + 1;
          if (iVar4 < 0) {
            puVar1 = (ulong *)br->buf_;
            if (puVar1 < br->buf_max_) {
              uVar2 = *puVar1;
              br->buf_ = (uint8_t *)((long)puVar1 + 7);
              bVar6 = bVar6 << 0x38 |
                      ((uVar2 & 0xff000000000000) >> 0x28 | (uVar2 & 0xff0000000000) >> 0x18 |
                       (uVar2 & 0xff00000000) >> 8 | (uVar2 & 0xff000000) << 8 |
                       (uVar2 & 0xff0000) << 0x18 | (uVar2 & 0xff00) << 0x28 | uVar2 << 0x38) >> 8;
              br->value_ = bVar6;
              iVar4 = iVar4 + 0x38;
            }
            else {
              VP8LoadFinalBytes(br);
              iVar4 = br->bits_;
              bVar6 = br->value_;
            }
          }
          uVar7 = bVar5 * rVar13 >> 8;
          uVar12 = (uint)(bVar6 >> ((byte)iVar4 & 0x3f));
          if (uVar7 < uVar12) {
            uVar11 = rVar13 - uVar7;
            bVar6 = bVar6 - ((ulong)uVar7 + 1 << ((byte)iVar4 & 0x3f));
            br->value_ = bVar6;
          }
          else {
            uVar11 = uVar7 + 1;
          }
          uVar14 = 0x1f;
          if (uVar11 != 0) {
            for (; uVar11 >> uVar14 == 0; uVar14 = uVar14 - 1) {
            }
          }
          iVar4 = iVar4 - (uVar14 ^ 7);
          br->bits_ = iVar4;
          rVar13 = (uVar11 << ((byte)(uVar14 ^ 7) & 0x1f)) - 1;
          br->range_ = rVar13;
          iVar9 = (uint)(uVar7 < uVar12) + iVar9 * 2;
          bVar5 = *pbVar10;
        } while (bVar5 != 0);
      }
      return iVar9 + (8 << (sbyte)uVar8) + 3;
    }
    bVar5 = p[7];
    if (iVar4 < 0) {
      puVar1 = (ulong *)br->buf_;
      if (puVar1 < br->buf_max_) {
        uVar2 = *puVar1;
        br->buf_ = (uint8_t *)((long)puVar1 + 7);
        bVar6 = bVar6 << 0x38 |
                ((uVar2 & 0xff000000000000) >> 0x28 | (uVar2 & 0xff0000000000) >> 0x18 |
                 (uVar2 & 0xff00000000) >> 8 | (uVar2 & 0xff000000) << 8 |
                 (uVar2 & 0xff0000) << 0x18 | (uVar2 & 0xff00) << 0x28 | uVar2 << 0x38) >> 8;
        br->value_ = bVar6;
        iVar4 = iVar4 + 0x38;
      }
      else {
        VP8LoadFinalBytes(br);
        iVar4 = br->bits_;
        bVar6 = br->value_;
      }
    }
    uVar7 = bVar5 * rVar13 >> 8;
    uVar8 = (uint)(bVar6 >> ((byte)iVar4 & 0x3f));
    if (uVar7 < uVar8) {
      uVar12 = rVar13 - uVar7;
      bVar6 = bVar6 - ((ulong)uVar7 + 1 << ((byte)iVar4 & 0x3f));
      br->value_ = bVar6;
    }
    else {
      uVar12 = uVar7 + 1;
    }
    uVar11 = 0x1f;
    if (uVar12 != 0) {
      for (; uVar12 >> uVar11 == 0; uVar11 = uVar11 - 1) {
      }
    }
    iVar4 = iVar4 - (uVar11 ^ 7);
    rVar13 = (uVar12 << ((byte)(uVar11 ^ 7) & 0x1f)) - 1;
    br->bits_ = iVar4;
    br->range_ = rVar13;
    if (uVar7 < uVar8) {
      if (iVar4 < 0) {
        puVar1 = (ulong *)br->buf_;
        if (puVar1 < br->buf_max_) {
          uVar2 = *puVar1;
          br->buf_ = (uint8_t *)((long)puVar1 + 7);
          bVar6 = bVar6 << 0x38 |
                  ((uVar2 & 0xff000000000000) >> 0x28 | (uVar2 & 0xff0000000000) >> 0x18 |
                   (uVar2 & 0xff00000000) >> 8 | (uVar2 & 0xff000000) << 8 |
                   (uVar2 & 0xff0000) << 0x18 | (uVar2 & 0xff00) << 0x28 | uVar2 << 0x38) >> 8;
          br->value_ = bVar6;
          iVar4 = iVar4 + 0x38;
        }
        else {
          VP8LoadFinalBytes(br);
          iVar4 = br->bits_;
          bVar6 = br->value_;
        }
      }
      uVar8 = rVar13 * 0xa5 >> 8;
      if (uVar8 < (uint)(bVar6 >> ((byte)iVar4 & 0x3f))) {
        uVar7 = rVar13 - uVar8;
        bVar6 = bVar6 - ((ulong)uVar8 + 1 << ((byte)iVar4 & 0x3f));
        br->value_ = bVar6;
        iVar9 = 9;
      }
      else {
        uVar7 = uVar8 + 1;
        iVar9 = 7;
      }
      uVar8 = 0x1f;
      if (uVar7 != 0) {
        for (; uVar7 >> uVar8 == 0; uVar8 = uVar8 - 1) {
        }
      }
      rVar13 = (uVar7 << ((byte)(uVar8 ^ 7) & 0x1f)) - 1;
      iVar4 = iVar4 - (uVar8 ^ 7);
      br->bits_ = iVar4;
      br->range_ = rVar13;
      if (iVar4 < 0) {
        puVar1 = (ulong *)br->buf_;
        if (puVar1 < br->buf_max_) {
          uVar2 = *puVar1;
          br->buf_ = (uint8_t *)((long)puVar1 + 7);
          bVar6 = bVar6 << 0x38 |
                  ((uVar2 & 0xff000000000000) >> 0x28 | (uVar2 & 0xff0000000000) >> 0x18 |
                   (uVar2 & 0xff00000000) >> 8 | (uVar2 & 0xff000000) << 8 |
                   (uVar2 & 0xff0000) << 0x18 | (uVar2 & 0xff00) << 0x28 | uVar2 << 0x38) >> 8;
          br->value_ = bVar6;
          iVar4 = iVar4 + 0x38;
        }
        else {
          VP8LoadFinalBytes(br);
          iVar4 = br->bits_;
          bVar6 = br->value_;
        }
      }
      uVar8 = rVar13 * 0x91 >> 8;
      uVar7 = (uint)(bVar6 >> ((byte)iVar4 & 0x3f));
      if (uVar8 < uVar7) {
        uVar12 = rVar13 - uVar8;
        br->value_ = bVar6 - ((ulong)uVar8 + 1 << ((byte)iVar4 & 0x3f));
      }
      else {
        uVar12 = uVar8 + 1;
      }
      uVar11 = 0x1f;
      if (uVar12 != 0) {
        for (; uVar12 >> uVar11 == 0; uVar11 = uVar11 - 1) {
        }
      }
      br->bits_ = iVar4 - (uVar11 ^ 7);
      br->range_ = (uVar12 << ((byte)(uVar11 ^ 7) & 0x1f)) - 1;
      return iVar9 + (uint)(uVar8 < uVar7);
    }
    if (iVar4 < 0) {
      puVar1 = (ulong *)br->buf_;
      if (puVar1 < br->buf_max_) {
        uVar2 = *puVar1;
        br->buf_ = (uint8_t *)((long)puVar1 + 7);
        bVar6 = bVar6 << 0x38 |
                ((uVar2 & 0xff000000000000) >> 0x28 | (uVar2 & 0xff0000000000) >> 0x18 |
                 (uVar2 & 0xff00000000) >> 8 | (uVar2 & 0xff000000) << 8 |
                 (uVar2 & 0xff0000) << 0x18 | (uVar2 & 0xff00) << 0x28 | uVar2 << 0x38) >> 8;
        br->value_ = bVar6;
        iVar4 = iVar4 + 0x38;
      }
      else {
        VP8LoadFinalBytes(br);
        iVar4 = br->bits_;
        bVar6 = br->value_;
      }
    }
    uVar8 = rVar13 * 0x9f >> 8;
    if (uVar8 < (uint)(bVar6 >> ((byte)iVar4 & 0x3f))) {
      uVar7 = rVar13 - uVar8;
      br->value_ = bVar6 - ((ulong)uVar8 + 1 << ((byte)iVar4 & 0x3f));
      iVar9 = 6;
    }
    else {
      uVar7 = uVar8 + 1;
      iVar9 = 5;
    }
    uVar8 = 0x1f;
    if (uVar7 != 0) {
      for (; uVar7 >> uVar8 == 0; uVar8 = uVar8 - 1) {
      }
    }
    iVar15 = uVar7 << ((byte)(uVar8 ^ 7) & 0x1f);
    br->bits_ = iVar4 - (uVar8 ^ 7);
  }
  else {
    bVar5 = p[4];
    if (iVar4 < 0) {
      puVar1 = (ulong *)br->buf_;
      if (puVar1 < br->buf_max_) {
        uVar2 = *puVar1;
        br->buf_ = (uint8_t *)((long)puVar1 + 7);
        bVar6 = bVar6 << 0x38 |
                ((uVar2 & 0xff000000000000) >> 0x28 | (uVar2 & 0xff0000000000) >> 0x18 |
                 (uVar2 & 0xff00000000) >> 8 | (uVar2 & 0xff000000) << 8 |
                 (uVar2 & 0xff0000) << 0x18 | (uVar2 & 0xff00) << 0x28 | uVar2 << 0x38) >> 8;
        br->value_ = bVar6;
        iVar4 = iVar4 + 0x38;
      }
      else {
        VP8LoadFinalBytes(br);
        iVar4 = br->bits_;
        bVar6 = br->value_;
      }
    }
    uVar7 = bVar5 * rVar13 >> 8;
    uVar8 = (uint)(bVar6 >> ((byte)iVar4 & 0x3f));
    if (uVar7 < uVar8) {
      uVar12 = rVar13 - uVar7;
      bVar6 = bVar6 - ((ulong)uVar7 + 1 << ((byte)iVar4 & 0x3f));
      br->value_ = bVar6;
    }
    else {
      uVar12 = uVar7 + 1;
    }
    uVar11 = 0x1f;
    if (uVar12 != 0) {
      for (; uVar12 >> uVar11 == 0; uVar11 = uVar11 - 1) {
      }
    }
    iVar4 = iVar4 - (uVar11 ^ 7);
    rVar13 = (uVar12 << ((byte)(uVar11 ^ 7) & 0x1f)) - 1;
    br->bits_ = iVar4;
    br->range_ = rVar13;
    if (uVar8 <= uVar7) {
      return 2;
    }
    bVar5 = p[5];
    if (iVar4 < 0) {
      puVar1 = (ulong *)br->buf_;
      if (puVar1 < br->buf_max_) {
        uVar2 = *puVar1;
        br->buf_ = (uint8_t *)((long)puVar1 + 7);
        bVar6 = bVar6 << 0x38 |
                ((uVar2 & 0xff000000000000) >> 0x28 | (uVar2 & 0xff0000000000) >> 0x18 |
                 (uVar2 & 0xff00000000) >> 8 | (uVar2 & 0xff000000) << 8 |
                 (uVar2 & 0xff0000) << 0x18 | (uVar2 & 0xff00) << 0x28 | uVar2 << 0x38) >> 8;
        br->value_ = bVar6;
        iVar4 = iVar4 + 0x38;
      }
      else {
        VP8LoadFinalBytes(br);
        iVar4 = br->bits_;
        bVar6 = br->value_;
      }
    }
    uVar8 = bVar5 * rVar13 >> 8;
    if (uVar8 < (uint)(bVar6 >> ((byte)iVar4 & 0x3f))) {
      uVar7 = rVar13 - uVar8;
      br->value_ = bVar6 - ((ulong)uVar8 + 1 << ((byte)iVar4 & 0x3f));
      iVar9 = 4;
    }
    else {
      uVar7 = uVar8 + 1;
      iVar9 = 3;
    }
    uVar8 = 0x1f;
    if (uVar7 != 0) {
      for (; uVar7 >> uVar8 == 0; uVar8 = uVar8 - 1) {
      }
    }
    iVar15 = uVar7 << ((byte)(uVar8 ^ 7) & 0x1f);
    br->bits_ = iVar4 - (uVar8 ^ 7);
  }
  br->range_ = iVar15 - 1;
  return iVar9;
}

Assistant:

static int GetLargeValue(VP8BitReader* const br, const uint8_t* const p) {
  int v;
  if (!VP8GetBit(br, p[3], "coeffs")) {
    if (!VP8GetBit(br, p[4], "coeffs")) {
      v = 2;
    } else {
      v = 3 + VP8GetBit(br, p[5], "coeffs");
    }
  } else {
    if (!VP8GetBit(br, p[6], "coeffs")) {
      if (!VP8GetBit(br, p[7], "coeffs")) {
        v = 5 + VP8GetBit(br, 159, "coeffs");
      } else {
        v = 7 + 2 * VP8GetBit(br, 165, "coeffs");
        v += VP8GetBit(br, 145, "coeffs");
      }
    } else {
      const uint8_t* tab;
      const int bit1 = VP8GetBit(br, p[8], "coeffs");
      const int bit0 = VP8GetBit(br, p[9 + bit1], "coeffs");
      const int cat = 2 * bit1 + bit0;
      v = 0;
      for (tab = kCat3456[cat]; *tab; ++tab) {
        v += v + VP8GetBit(br, *tab, "coeffs");
      }
      v += 3 + (8 << cat);
    }
  }
  return v;
}